

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O3

void __thiscall
InterpreterTestSuite_MNSV_SameResolutionFromTwoAliasesCollapses_Test::TestBody
          (InterpreterTestSuite_MNSV_SameResolutionFromTwoAliasesCollapses_Test *this)

{
  _func_int **pp_Var1;
  size_type sVar2;
  undefined8 *puVar3;
  Registry *this_00;
  bool bVar4;
  char *pcVar5;
  char *message;
  Status local_44a;
  Status local_449;
  string local_448;
  string local_428;
  internal local_408 [8];
  undefined8 *local_400;
  string local_3f8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> nids;
  Expression ret;
  string local_390;
  State local_370;
  State local_36c;
  ByteArray local_368;
  ByteArray local_348;
  char *local_330;
  string local_328;
  string local_308;
  UnixTime local_2e8;
  UnixTime local_2e0;
  undefined1 local_2d8 [56];
  char local_2a0 [320];
  TestContext ctx;
  
  InterpreterTestSuite::TestContext::TestContext(&ctx);
  InterpreterTestSuite::InitContext(&this->super_InterpreterTestSuite,&ctx);
  this_00 = ctx.mRegistry;
  local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"127.0.0.1","");
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"1.1","");
  ot::commissioner::BorderAgent::State::State(&local_36c,0,0,0,0,0);
  ret.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&ret.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"net1","");
  nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
  std::__cxx11::string::_M_construct<char_const*>((string *)&nids,"");
  local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"");
  local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"domain1","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  pcVar5 = "";
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"","");
  ot::commissioner::UnixTime::UnixTime(&local_2e0,0);
  ot::commissioner::BorderAgent::BorderAgent
            ((BorderAgent *)local_2d8,&local_448,0x4e21,&local_348,&local_3f8,local_36c,
             (string *)&ret,1,(string *)&nids,&local_428,(Timestamp)0x0,0,&local_390,&local_368,
             &local_308,'\0',0,&local_328,local_2e0,0x103f);
  local_449 = ot::commissioner::persistent_storage::Registry::Add(this_00,(BorderAgent *)local_2d8);
  local_44a = kSuccess;
  testing::internal::
  CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
            (local_408,
             "ctx.mRegistry->Add(BorderAgent{\"127.0.0.1\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net1\", 1, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain1\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
             ,"RegistryStatus::kSuccess",&local_449,&local_44a);
  ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_2d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p);
  }
  if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_428._M_dataplus._M_p != &local_428.field_2) {
    operator_delete(local_428._M_dataplus._M_p);
  }
  if ((pointer *)
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage) {
    operator_delete(nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)&ret.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    operator_delete(ret.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_448._M_dataplus._M_p != &local_448.field_2) {
    operator_delete(local_448._M_dataplus._M_p);
  }
  puVar3 = local_400;
  if (local_408[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if (local_400 != (undefined8 *)0x0) {
      pcVar5 = (char *)*local_400;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_448,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x1bd,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_448,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
    if ((_func_int **)local_2d8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_2d8._0_8_ + 8))();
    }
    if (local_400 == (undefined8 *)0x0) goto LAB_0014b5f3;
    if ((undefined8 *)*local_400 != local_400 + 2) {
      operator_delete((undefined8 *)*local_400);
    }
  }
  else {
    if (local_400 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_400 != local_400 + 2) {
        operator_delete((undefined8 *)*local_400);
      }
      operator_delete(puVar3);
    }
    local_448._M_dataplus._M_p = (pointer)&local_448.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_448,"127.0.0.2","");
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f8,"1.1","");
    ot::commissioner::BorderAgent::State::State(&local_370,0,0,0,0,0);
    ret.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)&ret.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&ret,"net2","");
    nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)&nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
    std::__cxx11::string::_M_construct<char_const*>((string *)&nids,"");
    local_428._M_dataplus._M_p = (pointer)&local_428.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_428,"");
    local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"");
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"domain2","");
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    local_330 = "";
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_328);
    ot::commissioner::UnixTime::UnixTime(&local_2e8,0);
    pcVar5 = (char *)(ulong)(uint)local_370;
    ot::commissioner::BorderAgent::BorderAgent
              ((BorderAgent *)local_2d8,&local_448,0x4e21,&local_348,&local_3f8,local_370,
               (string *)&ret,2,(string *)&nids,&local_428,(Timestamp)0x0,0,&local_390,&local_368,
               &local_308,'\0',0,&local_328,local_2e8,0x103f);
    local_449 = ot::commissioner::persistent_storage::Registry::Add
                          (ctx.mRegistry,(BorderAgent *)local_2d8);
    local_44a = kSuccess;
    testing::internal::
    CmpHelperEQ<ot::commissioner::persistent_storage::Registry::Status,ot::commissioner::persistent_storage::Registry::Status>
              (local_408,
               "ctx.mRegistry->Add(BorderAgent{\"127.0.0.2\", 20001, ByteArray{}, \"1.1\", BorderAgent::State{0, 0, 0, 0, 0}, \"net2\", 2, \"\", \"\", Timestamp{0, 0, 0}, 0, \"\", ByteArray{}, \"domain2\", 0, 0, \"\", 0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit})"
               ,"RegistryStatus::kSuccess",&local_449,&local_44a);
    ot::commissioner::BorderAgent::~BorderAgent((BorderAgent *)local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308._M_dataplus._M_p != &local_308.field_2) {
      operator_delete(local_308._M_dataplus._M_p);
    }
    if (local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_368.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390._M_dataplus._M_p != &local_390.field_2) {
      operator_delete(local_390._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_428._M_dataplus._M_p != &local_428.field_2) {
      operator_delete(local_428._M_dataplus._M_p);
    }
    if ((pointer *)
        nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                      .super__Vector_impl_data._M_start);
    }
    if (ret.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (pointer)&ret.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      operator_delete(ret.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
      operator_delete(local_3f8._M_dataplus._M_p);
    }
    if (local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_348.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_448._M_dataplus._M_p != &local_448.field_2) {
      operator_delete(local_448._M_dataplus._M_p);
    }
    if (local_408[0] != (internal)0x0) {
      if (local_400 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_400 != local_400 + 2) {
          operator_delete((undefined8 *)*local_400);
        }
        operator_delete(local_400);
      }
      local_3f8.field_2._M_allocated_capacity = 0;
      local_3f8._M_dataplus._M_p = (pointer)0x0;
      local_3f8._M_string_length = 0;
      ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      ret.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pp_Var1 = (_func_int **)(local_2d8 + 0x10);
      local_2d8._0_8_ = pp_Var1;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"start --nwk 1 net1","");
      ot::commissioner::Interpreter::ParseExpression
                ((Expression *)&local_428,&ctx.mInterpreter,(string *)local_2d8);
      local_448.field_2._M_allocated_capacity = local_3f8.field_2._M_allocated_capacity;
      local_448._M_string_length = local_3f8._M_string_length;
      local_448._M_dataplus._M_p = local_3f8._M_dataplus._M_p;
      local_3f8.field_2._M_allocated_capacity = local_428.field_2._M_allocated_capacity;
      local_3f8._M_dataplus._M_p = local_428._M_dataplus._M_p;
      local_3f8._M_string_length = local_428._M_string_length;
      local_428._M_dataplus._M_p = (pointer)0x0;
      local_428._M_string_length = 0;
      local_428.field_2._M_allocated_capacity = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_448);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_428);
      if ((_func_int **)local_2d8._0_8_ != pp_Var1) {
        operator_delete((void *)local_2d8._0_8_);
      }
      ot::commissioner::Interpreter::ReParseMultiNetworkSyntax
                ((Error *)local_2d8,&ctx.mInterpreter,(Expression *)&local_3f8,&ret);
      local_428._M_dataplus._M_p._0_4_ = local_2d8._0_4_;
      local_390._M_dataplus._M_p = local_390._M_dataplus._M_p & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<ot::commissioner::ErrorCode,ot::commissioner::ErrorCode>
                ((internal *)&local_448,
                 "ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode()",
                 "ErrorCode::kNone",(ErrorCode *)&local_428,(ErrorCode *)&local_390);
      if ((undefined1 *)local_2d8._8_8_ != local_2d8 + 0x18) {
        operator_delete((void *)local_2d8._8_8_);
      }
      if ((char)local_448._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)local_2d8);
        if ((undefined8 *)local_448._M_string_length == (undefined8 *)0x0) {
          message = "";
        }
        else {
          message = *(char **)local_448._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_428,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c7,message);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_428,(Message *)local_2d8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
        if ((_func_int **)local_2d8._0_8_ != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_2d8._0_8_ + 8))();
        }
      }
      sVar2 = local_448._M_string_length;
      if ((undefined8 *)local_448._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_448._M_string_length !=
            (undefined8 *)(local_448._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_448._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      ot::commissioner::Interpreter::ValidateMultiNetworkSyntax
                ((Value *)local_2d8,&ctx.mInterpreter,&ret,&nids);
      bVar4 = ot::commissioner::Interpreter::Value::HasNoError((Value *)local_2d8);
      local_448._M_dataplus._M_p._0_1_ = bVar4;
      local_448._M_string_length = 0;
      if ((char *)local_2d8._40_8_ != local_2a0) {
        operator_delete((void *)local_2d8._40_8_);
      }
      if ((undefined1 *)local_2d8._8_8_ != local_2d8 + 0x18) {
        operator_delete((void *)local_2d8._8_8_);
      }
      if ((char)local_448._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_428);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_2d8,(internal *)&local_448,
                   (AssertionResult *)
                   "ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError()","false",
                   "true",pcVar5);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_390,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c8,(char *)local_2d8._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_390,(Message *)&local_428)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_390);
        if ((_func_int **)local_2d8._0_8_ != pp_Var1) {
          operator_delete((void *)local_2d8._0_8_);
        }
        if ((long *)local_428._M_dataplus._M_p != (long *)0x0) {
          (**(code **)(*(long *)local_428._M_dataplus._M_p + 8))();
        }
      }
      sVar2 = local_448._M_string_length;
      if ((undefined8 *)local_448._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_448._M_string_length !=
            (undefined8 *)(local_448._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_448._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      local_448._M_dataplus._M_p =
           (pointer)((long)nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3);
      local_428._M_dataplus._M_p._0_4_ = 1;
      testing::internal::CmpHelperEQ<unsigned_long,int>
                ((internal *)local_2d8,"nids.size()","1",(unsigned_long *)&local_448,
                 (int *)&local_428);
      if (local_2d8[0] == (string)0x0) {
        testing::Message::Message((Message *)&local_448);
        if ((pointer)local_2d8._8_8_ == (pointer)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = *(char **)local_2d8._8_8_;
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_428,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
                   ,0x1c9,pcVar5);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_428,(Message *)&local_448)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_428);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_448._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_448._M_dataplus._M_p + 8))();
        }
      }
      if ((pointer)local_2d8._8_8_ != (pointer)0x0) {
        if (*(pointer *)local_2d8._8_8_ != (pointer)(local_2d8._8_8_ + 0x10)) {
          operator_delete(*(pointer *)local_2d8._8_8_);
        }
        operator_delete((void *)local_2d8._8_8_);
      }
      if (nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(nids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&ret);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_3f8);
      goto LAB_0014b5f3;
    }
    testing::Message::Message((Message *)local_2d8);
    if (local_400 != (undefined8 *)0x0) {
      local_330 = (char *)*local_400;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_448,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/interpreter_test.cpp"
               ,0x1c2,local_330);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_448,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_448);
    if ((_func_int **)local_2d8._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_2d8._0_8_ + 8))();
    }
    if (local_400 == (undefined8 *)0x0) goto LAB_0014b5f3;
    if ((undefined8 *)*local_400 != local_400 + 2) {
      operator_delete((undefined8 *)*local_400);
    }
  }
  operator_delete(local_400);
LAB_0014b5f3:
  InterpreterTestSuite::TestContext::~TestContext(&ctx);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, MNSV_SameResolutionFromTwoAliasesCollapses)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    Interpreter::Expression expr, ret;
    std::vector<uint64_t>   nids;
    expr = ctx.mInterpreter.ParseExpression("start --nwk 1 net1");
    EXPECT_EQ(ctx.mInterpreter.ReParseMultiNetworkSyntax(expr, ret).GetCode(), ErrorCode::kNone);
    EXPECT_TRUE(ctx.mInterpreter.ValidateMultiNetworkSyntax(ret, nids).HasNoError());
    EXPECT_EQ(nids.size(), 1);
}